

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.cc
# Opt level: O3

void matras_gh_1145_test(void)

{
  size_t sVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  char *m;
  char *pcVar5;
  int iVar6;
  ulong uVar7;
  matras mStack_350;
  matras_view mStack_2f8;
  matras_view mStack_2d8;
  uint uStack_2b4;
  matras *pmStack_2b0;
  matras *pmStack_2a8;
  undefined *puStack_2a0;
  matras_id_t *pmStack_298;
  ulong uStack_290;
  code *pcStack_288;
  matras mStack_278;
  uint uStack_21c;
  matras *pmStack_218;
  matras *pmStack_210;
  undefined *puStack_208;
  matras_id_t *pmStack_200;
  ulong uStack_1f8;
  code *apcStack_1f0 [2];
  matras mStack_1e0;
  uint uStack_184;
  matras *pmStack_180;
  matras *pmStack_178;
  char *pcStack_170;
  char *pcStack_168;
  matras_stats *pmStack_160;
  code *pcStack_158;
  matras mStack_150;
  matras_view mStack_f8;
  matras_id_t mStack_d4;
  matras_stats mStack_d0;
  matras *pmStack_c8;
  code *pcStack_a0;
  undefined1 local_98 [8];
  matras local;
  matras_view view;
  matras_id_t id;
  
  pcStack_a0 = (code *)0x103944;
  _space(_stdout);
  pcStack_a0 = (code *)0x103959;
  printf("# *** %s ***\n","matras_gh_1145_test");
  pcStack_a0 = (code *)0x103963;
  plan(1);
  extents_in_use = 0;
  pcStack_a0 = (code *)0x10398b;
  matras_create((matras *)local_98,8,&ver_allocator,(matras_stats *)0x0);
  pcStack_a0 = (code *)0x103997;
  matras_create_read_view((matras *)local_98,(matras_view *)&local.stats);
  pcStack_a0 = (code *)0x1039a3;
  pvVar4 = matras_alloc((matras *)local_98,(matras_id_t *)((long)&view.next_view + 4));
  if (pvVar4 == (void *)0x0) {
    pcStack_a0 = (code *)0x103a3c;
    matras_gh_1145_test();
  }
  else {
    pcStack_a0 = (code *)0x1039bb;
    pvVar4 = matras_touch((matras *)local_98,view.next_view._4_4_);
    if (pvVar4 != (void *)0x0) {
      pcStack_a0 = (code *)0x1039cc;
      matras_destroy_read_view((matras *)local_98,(matras_view *)&local.stats);
      pcStack_a0 = (code *)0x1039d4;
      matras_destroy((matras *)local_98);
      pcStack_a0 = (code *)0x103a09;
      _ok((uint)(extents_in_use == 0),"extents_in_use == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x115
          ,"line %d",0x115);
      pcStack_a0 = (code *)0x103a11;
      _space(_stdout);
      pcStack_a0 = (code *)0x103a26;
      printf("# *** %s: done ***\n","matras_gh_1145_test");
      pcStack_a0 = (code *)0x103a2b;
      check_plan();
      return;
    }
  }
  pcStack_a0 = matras_stats_test;
  matras_gh_1145_test();
  pcStack_158 = (code *)0x103a64;
  pmStack_c8 = (matras *)local_98;
  pcStack_a0 = (code *)&stack0xfffffffffffffff8;
  _space(_stdout);
  pcStack_158 = (code *)0x103a7c;
  printf("# *** %s ***\n","matras_stats_test");
  pcStack_158 = (code *)0x103a86;
  plan(0xc);
  mStack_d0.extent_count = 0;
  mStack_d0.read_view_extent_count = 0;
  pcVar5 = "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc";
  m = "line %d";
  pcStack_158 = (code *)0x103ac2;
  _ok(1,"stats.extent_count == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x123,
      "line %d",0x123);
  pcStack_158 = (code *)0x103ae6;
  _ok(1,"stats.read_view_extent_count == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x124,
      "line %d",0x124);
  extents_in_use = 0;
  pcStack_158 = (code *)0x103b0b;
  matras_create(&mStack_150,8,&ver_allocator,&mStack_d0);
  pcStack_158 = (code *)0x103b30;
  _ok((uint)(mStack_d0.extent_count == 0),"stats.extent_count == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x129,
      "line %d",0x129);
  pcStack_158 = (code *)0x103b5a;
  _ok((uint)(mStack_d0.read_view_extent_count == 0),"stats.read_view_extent_count == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x12a,
      "line %d",0x12a);
  pcStack_158 = (code *)0x103b66;
  pvVar4 = matras_alloc(&mStack_150,&mStack_d4);
  if (pvVar4 == (void *)0x0) {
    pcStack_158 = (code *)0x103d54;
    matras_stats_test();
  }
  else {
    pcVar5 = "line %d";
    pcStack_158 = (code *)0x103ba6;
    _ok((uint)(mStack_d0.extent_count == 3),"stats.extent_count == 3",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x12e,
        "line %d",0x12e);
    pcStack_158 = (code *)0x103bcf;
    _ok((uint)(mStack_d0.read_view_extent_count == 0),"stats.read_view_extent_count == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x12f,
        "line %d",0x12f);
    m = (char *)&mStack_150;
    pcStack_158 = (code *)0x103be2;
    matras_create_read_view((matras *)m,&mStack_f8);
    pcStack_158 = (code *)0x103bed;
    pvVar4 = matras_touch((matras *)m,mStack_d4);
    if (pvVar4 != (void *)0x0) {
      pcStack_158 = (code *)0x103c2d;
      _ok((uint)(mStack_d0.extent_count == 6),"stats.extent_count == 6",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x134
          ,"line %d",0x134);
      pcStack_158 = (code *)0x103c56;
      _ok((uint)(mStack_d0.read_view_extent_count == 3),"stats.read_view_extent_count == 3",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x135
          ,"line %d",0x135);
      pcStack_158 = (code *)0x103c69;
      matras_destroy_read_view(&mStack_150,&mStack_f8);
      pcStack_158 = (code *)0x103c92;
      _ok((uint)(mStack_d0.extent_count == 3),"stats.extent_count == 3",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x138
          ,"line %d",0x138);
      pcStack_158 = (code *)0x103cbe;
      _ok((uint)(mStack_d0.read_view_extent_count == 0),"stats.read_view_extent_count == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x139
          ,"line %d",0x139);
      pcStack_158 = (code *)0x103cc6;
      matras_destroy(&mStack_150);
      pcStack_158 = (code *)0x103cef;
      _ok((uint)(mStack_d0.extent_count == 0),"stats.extent_count == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x13c
          ,"line %d",0x13c);
      pcStack_158 = (code *)0x103d14;
      _ok((uint)(mStack_d0.read_view_extent_count == 0),"stats.read_view_extent_count == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x13d
          ,"line %d",0x13d);
      pcStack_158 = (code *)0x103d23;
      _space(_stdout);
      pcStack_158 = (code *)0x103d38;
      printf("# *** %s: done ***\n","matras_stats_test");
      pcStack_158 = (code *)0x103d3d;
      check_plan();
      return;
    }
  }
  pcStack_158 = matras_alloc_overflow_test;
  matras_stats_test();
  pcStack_170 = "stats.extent_count == 0";
  apcStack_1f0[0] = (code *)0x103d7a;
  pmStack_180 = (matras *)m;
  pmStack_178 = &mStack_150;
  pcStack_168 = pcVar5;
  pmStack_160 = &mStack_d0;
  pcStack_158 = (code *)&pcStack_a0;
  _space(_stdout);
  uVar7 = 0;
  apcStack_1f0[0] = (code *)0x103d92;
  printf("# *** %s ***\n","matras_alloc_overflow_test");
  apcStack_1f0[0] = (code *)0x103d9c;
  plan(2);
  apcStack_1f0[0] = (code *)0x103db9;
  matras_create(&mStack_1e0,0x10,&pta_allocator,(matras_stats *)0x0);
  while( true ) {
    apcStack_1f0[0] = (code *)0x103dc8;
    pvVar4 = matras_alloc(&mStack_1e0,&uStack_184);
    if (pvVar4 == (void *)0x0) break;
    if (uVar7 != uStack_184) goto LAB_00103ea0;
    uVar7 = uVar7 + 1;
    if (uVar7 == 0x100) {
      apcStack_1f0[0] = (code *)0x103dff;
      pvVar4 = matras_alloc(&mStack_1e0,&uStack_184);
      apcStack_1f0[0] = (code *)0x103e35;
      _ok((uint)(pvVar4 == (void *)0x0),"matras_alloc(&mat, &id) == NULL",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x156
          ,"line %d",0x156);
      apcStack_1f0[0] = (code *)0x103e61;
      _ok((uint)(uStack_184 == 0xff),"id == max_capacity - 1",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x157
          ,"line %d",0x157);
      apcStack_1f0[0] = (code *)0x103e69;
      matras_destroy(&mStack_1e0);
      apcStack_1f0[0] = (code *)0x103e72;
      _space(_stdout);
      apcStack_1f0[0] = (code *)0x103e87;
      printf("# *** %s: done ***\n","matras_alloc_overflow_test");
      apcStack_1f0[0] = (code *)0x103e8c;
      check_plan();
      return;
    }
  }
  apcStack_1f0[0] = (code *)0x103ea0;
  matras_alloc_overflow_test();
LAB_00103ea0:
  apcStack_1f0[0] = matras_alloc_range_overflow_test;
  matras_alloc_overflow_test();
  puStack_208 = &stdout;
  pcStack_288 = (code *)0x103ec6;
  pmStack_218 = &mStack_1e0;
  pmStack_210 = &mStack_150;
  pmStack_200 = &uStack_184;
  uStack_1f8 = uVar7;
  apcStack_1f0[0] = (code *)&pcStack_158;
  _space(_stdout);
  pcStack_288 = (code *)0x103edb;
  printf("# *** %s ***\n","matras_alloc_range_overflow_test");
  pcStack_288 = (code *)0x103ee5;
  plan(2);
  pcStack_288 = (code *)0x103f02;
  matras_create(&mStack_278,0x10,&pta_allocator,(matras_stats *)0x0);
  uVar7 = 0xfffffffffffffffc;
  while( true ) {
    pcStack_288 = (code *)0x103f1d;
    pvVar4 = matras_alloc_range(&mStack_278,&uStack_21c,4);
    if (pvVar4 == (void *)0x0) break;
    uVar7 = uVar7 + 4;
    if (uVar7 != uStack_21c) goto LAB_00103ffb;
    if (0xfb < uVar7) {
      pcStack_288 = (code *)0x103f5a;
      pvVar4 = matras_alloc_range(&mStack_278,&uStack_21c,4);
      pcStack_288 = (code *)0x103f90;
      _ok((uint)(pvVar4 == (void *)0x0),"matras_alloc_range(&mat, &id, range_count) == NULL",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x172
          ,"line %d",0x172);
      pcStack_288 = (code *)0x103fbc;
      _ok((uint)(uStack_21c == 0xfc),"id == max_capacity - range_count",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x173
          ,"line %d",0x173);
      pcStack_288 = (code *)0x103fc4;
      matras_destroy(&mStack_278);
      pcStack_288 = (code *)0x103fcd;
      _space(_stdout);
      pcStack_288 = (code *)0x103fe2;
      printf("# *** %s: done ***\n","matras_alloc_range_overflow_test");
      pcStack_288 = (code *)0x103fe7;
      check_plan();
      return;
    }
  }
  pcStack_288 = (code *)0x103ffb;
  matras_alloc_range_overflow_test();
LAB_00103ffb:
  pcStack_288 = matras_touch_reserve_test;
  matras_alloc_range_overflow_test();
  puStack_2a0 = &stdout;
  pmStack_2b0 = &mStack_278;
  pmStack_2a8 = &mStack_150;
  pmStack_298 = &uStack_21c;
  uStack_290 = uVar7;
  pcStack_288 = (code *)apcStack_1f0;
  _space(_stdout);
  uVar7 = 0;
  printf("# *** %s ***\n","matras_touch_reserve_test");
  plan(0xe);
  matras_create(&mStack_350,0x10,&pta_allocator,(matras_stats *)0x0);
  matras_create_read_view(&mStack_350,&mStack_2f8);
  do {
    pvVar4 = matras_alloc(&mStack_350,&uStack_2b4);
    if (pvVar4 == (void *)0x0) {
      matras_touch_reserve_test();
LAB_00104589:
      matras_touch_reserve_test();
      goto LAB_0010458e;
    }
    if (uVar7 != uStack_2b4) goto LAB_00104589;
    uVar7 = uVar7 + 1;
  } while (uVar7 != 0x100);
  pvVar4 = matras_alloc(&mStack_350,&uStack_2b4);
  iVar6 = 0;
  _ok((uint)(pvVar4 == (void *)0x0),"matras_alloc(&mat, &id) == NULL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x195,
      "line %d",0x195);
  _ok((uint)(uStack_2b4 == 0xff),"id == max_capacity - 1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x196,
      "line %d",0x196);
  sVar1 = AllocatedCount;
  matras_touch_reserve(&mStack_350,0);
  _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x19b,
      "line %d",0x19b);
  matras_touch_reserve(&mStack_350,1);
  _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x19d,
      "line %d",0x19d);
  matras_touch_reserve(&mStack_350,0x80);
  _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x19f,
      "line %d",0x19f);
  matras_touch_reserve(&mStack_350,0x100);
  _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1a1,
      "line %d",0x1a1);
  matras_destroy_read_view(&mStack_350,&mStack_2f8);
  sVar1 = AllocatedCount;
  matras_touch_reserve(&mStack_350,0);
  _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1a7,
      "line %d",0x1a7);
  matras_touch_reserve(&mStack_350,1);
  _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1a9,
      "line %d",0x1a9);
  matras_touch_reserve(&mStack_350,0x80);
  _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1ab,
      "line %d",0x1ab);
  matras_touch_reserve(&mStack_350,0x100);
  _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1ad,
      "line %d",0x1ad);
  matras_create_read_view(&mStack_350,&mStack_2d8);
  sVar1 = AllocatedCount;
  matras_touch_reserve(&mStack_350,2);
  _ok((uint)(AllocatedCount == sVar1 + 5),"AllocatedCount == extents_in_use_before_reserve + 5",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1b6,
      "line %d",0x1b6);
  matras_touch(&mStack_350,0);
  matras_touch(&mStack_350,uStack_2b4);
  _ok((uint)(AllocatedCount == sVar1 + 5),"AllocatedCount == extents_in_use_before_reserve + 5",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1ba,
      "line %d",0x1ba);
  matras_destroy_read_view(&mStack_350,&mStack_2d8);
  matras_create_read_view(&mStack_350,&mStack_2d8);
  matras_touch(&mStack_350,uStack_2b4 >> 1);
  sVar1 = AllocatedCount;
  matras_touch_reserve(&mStack_350,2);
  _ok((uint)(AllocatedCount == sVar1 + 4),"AllocatedCount == extents_in_use_before_reserve + 4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1c7,
      "line %d",0x1c7);
  matras_touch(&mStack_350,0);
  matras_touch(&mStack_350,uStack_2b4);
  _ok((uint)(AllocatedCount == sVar1 + 4),"AllocatedCount == extents_in_use_before_reserve + 4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1cb,
      "line %d",0x1cb);
  do {
    uVar2 = rand();
    matras_touch_reserve(&mStack_350,uVar2 & 0xff);
    sVar1 = AllocatedCount;
    uVar2 = uVar2 & 0xff;
    if (uVar2 != 0) {
      do {
        uVar3 = rand();
        matras_touch(&mStack_350,uVar3 & 0xff);
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
      if (AllocatedCount != sVar1) goto LAB_0010458e;
    }
    iVar6 = iVar6 + 1;
  } while (iVar6 != 10000);
  iVar6 = 0;
  do {
    matras_destroy_read_view(&mStack_350,&mStack_2d8);
    matras_create_read_view(&mStack_350,&mStack_2d8);
    uVar2 = rand();
    matras_touch_reserve(&mStack_350,uVar2 & 0xff);
    sVar1 = AllocatedCount;
    uVar2 = uVar2 & 0xff;
    if (uVar2 != 0) {
      do {
        uVar3 = rand();
        matras_touch(&mStack_350,uVar3 & 0xff);
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
      if (AllocatedCount != sVar1) goto LAB_00104593;
    }
    iVar6 = iVar6 + 1;
    if (iVar6 == 10000) {
      matras_destroy_read_view(&mStack_350,&mStack_2d8);
      matras_destroy(&mStack_350);
      _space(_stdout);
      printf("# *** %s: done ***\n","matras_touch_reserve_test");
      check_plan();
      return;
    }
  } while( true );
LAB_0010458e:
  matras_touch_reserve_test();
LAB_00104593:
  matras_touch_reserve_test();
  plan(7);
  _space(_stdout);
  printf("# *** %s ***\n","main");
  matras_allocator_create(&pta_allocator,0x40,pta_alloc,pta_free);
  matras_allocator_create(&ver_allocator,0x200,all,dea);
  matras_alloc_test();
  matras_vers_test();
  matras_gh_1145_test();
  matras_stats_test();
  matras_alloc_overflow_test();
  matras_alloc_range_overflow_test();
  matras_touch_reserve_test();
  matras_allocator_destroy(&pta_allocator);
  matras_allocator_destroy(&ver_allocator);
  _space(_stdout);
  printf("# *** %s: done ***\n","main");
  check_plan();
  return;
}

Assistant:

void
matras_gh_1145_test()
{
	header();
	plan(1);

	struct matras local;
	extents_in_use = 0;
	matras_create(&local, sizeof(type_t), &ver_allocator, NULL);
	struct matras_view view;
	matras_create_read_view(&local, &view);
	matras_id_t id;
	fail_unless(matras_alloc(&local, &id) != NULL);
	fail_unless(matras_touch(&local, id) != NULL);
	matras_destroy_read_view(&local, &view);
	matras_destroy(&local);
	ok(extents_in_use == 0);

	footer();
	check_plan();
}